

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O2

void speech_handler(CHAR_DATA *ch,CHAR_DATA *mob,SPEECH_DATA *speech)

{
  char cVar1;
  LINE_DATA *pLVar2;
  char *__src;
  int i;
  long lVar3;
  char *pstr;
  size_t sVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  char *pcVar5;
  int iVar6;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  SPEECH_DATA *speech_local;
  CHAR_DATA *mob_local;
  CHAR_DATA *ch_local;
  string local_12d8;
  string local_12b8;
  string buffer;
  string local_1278;
  char *local_1258 [2];
  char *local_1248;
  char buf [4608];
  
  if (speech == (SPEECH_DATA *)0x0) {
    return;
  }
  if (mob == (CHAR_DATA *)0x0 || speech->first_line == (LINE_DATA *)0x0) {
    return;
  }
  if (mob->in_room == (ROOM_INDEX_DATA *)0x0) {
    return;
  }
  if (mob->position < 5) {
    return;
  }
  pLVar2 = speech->current_line;
  if (pLVar2 == (LINE_DATA *)0x0) {
    speech->current_line = speech->first_line;
    return;
  }
  for (lVar3 = 0; lVar3 != 0x1200; lVar3 = lVar3 + 1) {
    buf[lVar3] = '\0';
  }
  speech_local = speech;
  mob_local = mob;
  ch_local = ch;
  pstr = palloc_string(pLVar2->text);
  iVar6 = 0;
  pcVar5 = pstr;
  do {
    cVar1 = *pcVar5;
    if (cVar1 == '$') {
      if (pcVar5[1] == 'N') {
        pcVar5 = pcVar5 + 1;
        __src = ch->name;
        strcat(buf,__src);
        sVar4 = strlen(__src);
        iVar6 = iVar6 + (int)sVar4 + -1;
      }
      else {
        buf[iVar6] = '$';
      }
    }
    else {
      if (cVar1 == '\0') break;
      buf[iVar6] = cVar1;
    }
    pcVar5 = pcVar5 + 1;
    iVar6 = iVar6 + 1;
  } while( true );
  free_pstring(pstr);
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  switch(pLVar2->type) {
  case 0:
    do_say(mob,buf);
    break;
  case 1:
    say_to(mob,ch,buf,"");
    break;
  case 2:
    local_1258[0] = ch->name;
    local_1248 = buf;
    fmt_00.size_ = 0xcc;
    fmt_00.data_ = (char *)0x5;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_1258;
    ::fmt::v9::vformat_abi_cxx11_(&local_1278,(v9 *)0x3ea493,fmt_00,args);
    std::__cxx11::string::operator=((string *)&buffer,(string *)&local_1278);
    std::__cxx11::string::~string((string *)&local_1278);
    do_tell(mob,buffer._M_dataplus._M_p);
    break;
  case 3:
    do_whisper(mob,buf);
    break;
  case 4:
    do_yell(mob,buf);
    break;
  case 5:
    do_emote(mob,buf);
    break;
  case 6:
    break;
  case 7:
    do_sing(mob,buf);
    break;
  default:
    fmt._M_str = "Error in speech -- missing/invalid type.";
    fmt._M_len = 0x28;
    CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt);
    goto LAB_002a1a1e;
  }
  pLVar2 = pLVar2->next;
  if (pLVar2 == (LINE_DATA *)0x0) {
    speech->current_line = speech->first_line;
  }
  else {
    speech->current_line = pLVar2;
    iVar6 = pLVar2->delay;
    if (iVar6 < 1) {
      speech_handler(ch,mob,speech);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_12b8,"speech_handler",(allocator<char> *)local_1258);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_12d8,"speech_handler",(allocator<char> *)&local_1278);
      CQueue::
      AddToQueue<void(*)(char_data*,char_data*,speech_data*),char_data*&,char_data*&,speech_data*&>
                (&RS.Queue,iVar6,&local_12b8,&local_12d8,speech_handler,&ch_local,&mob_local,
                 &speech_local);
      std::__cxx11::string::~string((string *)&local_12d8);
      std::__cxx11::string::~string((string *)&local_12b8);
    }
  }
LAB_002a1a1e:
  std::__cxx11::string::~string((string *)&buffer);
  return;
}

Assistant:

void speech_handler(CHAR_DATA *ch, CHAR_DATA *mob, SPEECH_DATA *speech)
{
	if (!speech || !speech->first_line || !mob || !mob->in_room)
		return;

	if (mob->position < POS_RESTING)
		return;

	auto line = speech->current_line;
	if (line == nullptr)
	{
		speech->current_line = speech->first_line;
		return;
	}

	char buf[MAX_STRING_LENGTH];
	for (auto i = 0; i < MAX_STRING_LENGTH; i++)
	{
		buf[i] = '\0';
	}

	auto copy = palloc_string(line->text);
	auto point = copy;

	for (auto i = 0; *point && *point != '\0'; i++)
	{
		if (*point == '$')
		{
			point++;
			if (*point == 'N')
			{
				strcat(buf, ch->name);
				i += (strlen(ch->name) - 1);
			}
			else
			{
				point--;
				buf[i] = *point;
			}
		}
		else
		{
			buf[i] = *point;
		}
		point++;
	}

	free_pstring(copy);

	std::string buffer; // outside of switch to appease the compiler gods
	switch (line->type)
	{
	case SPEECH_SAY:
		do_say(mob, buf);
		break;
	case SPEECH_SAYTO:
		say_to(mob, ch, buf, "");
		break;
	case SPEECH_TELL:
		buffer = fmt::format("{} {}", ch->name, buf);
		do_tell(mob, buffer.data());
		break;
	case SPEECH_WHISPER:
		do_whisper(mob, buf);
		break;
	case SPEECH_YELL:
		do_yell(mob, buf);
		break;
	case SPEECH_EMOTE:
		do_emote(mob, buf);
		break;
	case SPEECH_ECHO:
		break;
	case SPEECH_SING:
		do_sing(mob, buf);
		break;
	default:
		RS.Logger.Warn("Error in speech -- missing/invalid type.");
		return;
	}

	if (!line->next)
	{
		speech->current_line = speech->first_line;
		return;
	}

	speech->current_line = line->next;

	if (speech->current_line->delay <= 0)
	{
		speech_handler(ch, mob, speech);
		return;
	}

	RS.Queue.AddToQueue(speech->current_line->delay, "speech_handler", "speech_handler", speech_handler, ch, mob, speech);
}